

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O1

int arkSetMaxHnilWarns(void *arkode_mem,int mxhnil)

{
  int iVar1;
  
  if (arkode_mem == (void *)0x0) {
    iVar1 = -0x15;
    arkProcessError((ARKodeMem)0x0,-0x15,"ARKode","arkSetMaxHnilWarns","arkode_mem = NULL illegal.")
    ;
  }
  else {
    if (mxhnil == 0) {
      *(undefined4 *)((long)arkode_mem + 0x1c0) = 10;
    }
    else {
      *(int *)((long)arkode_mem + 0x1c0) = mxhnil;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int arkSetMaxHnilWarns(void *arkode_mem, int mxhnil)
{
  ARKodeMem ark_mem;
  if (arkode_mem==NULL) {
    arkProcessError(NULL, ARK_MEM_NULL, "ARKode",
                    "arkSetMaxHnilWarns", MSG_ARK_NO_MEM);
    return(ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem) arkode_mem;

  /* Passing mxhnil=0 sets the default, otherwise use input. */
  if (mxhnil == 0) {
    ark_mem->mxhnil = 10;
  } else {
    ark_mem->mxhnil = mxhnil;
  }

  return(ARK_SUCCESS);
}